

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O3

t_int * scalarmin_perform(t_int *w)

{
  float fVar1;
  float fVar2;
  t_int tVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  
  tVar3 = w[4];
  if ((int)tVar3 != 0) {
    fVar1 = *(float *)w[2];
    lVar4 = w[1];
    lVar5 = w[3];
    lVar6 = 0;
    do {
      fVar2 = *(float *)(lVar4 + lVar6 * 4);
      fVar7 = fVar1;
      if (fVar2 <= fVar1) {
        fVar7 = fVar2;
      }
      *(float *)(lVar5 + lVar6 * 4) = fVar7;
      lVar6 = lVar6 + 1;
    } while ((int)tVar3 != (int)lVar6);
  }
  return w + 5;
}

Assistant:

t_int *scalarmin_perform(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_float f = *(t_float *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    while (n--)
    {
        t_sample g = *in++;
        *out++ = (f < g ? f : g);
    }
    return (w+5);
}